

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser_cpp_test.cc
# Opt level: O2

void __thiscall
ctemplate_htmlparser::HtmlparserCppTest::ValidateState
          (HtmlparserCppTest *this,string *expected_state)

{
  __type _Var1;
  int enum_id;
  char *pcVar2;
  HtmlparserCppTest *this_00;
  allocator local_31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  this_00 = (HtmlparserCppTest *)&this->parser_;
  enum_id = HtmlParser::state((HtmlParser *)this_00);
  pcVar2 = IdToName(this_00,(IdNameMap *)kStateMap,enum_id);
  if (expected_state->_M_string_length == 0) {
    fprintf(_stderr,"Check failed: %s\n","!expected_state.empty()");
  }
  else {
    std::__cxx11::string::string((string *)&local_30,pcVar2,&local_31);
    _Var1 = std::operator==(expected_state,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    if (_Var1) {
      return;
    }
    fprintf(_stderr,"Check failed: %s %s %s\n","expected_state","==","string(parsed_state)");
  }
  exit(1);
}

Assistant:

void HtmlparserCppTest::ValidateState(const string &expected_state) {
  const char* parsed_state = IdToName(kStateMap, parser_.state());
  EXPECT_TRUE(parsed_state != NULL);
  EXPECT_TRUE(!expected_state.empty());
  EXPECT_EQ(expected_state, string(parsed_state))
      << "Unexpected state at line " << parser_.line_number();
}